

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_TweakConversionTest_Test::TestBody(Privkey_TweakConversionTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  Pubkey local_2c0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_278 [8];
  Pubkey expect_pubkey_1;
  Message local_258;
  string local_250;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  Message local_218;
  Privkey local_210;
  undefined1 local_1f0 [8];
  Privkey priv_tweak_mul;
  AssertHelper local_1b0;
  Message local_1a8;
  Pubkey local_1a0;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  undefined1 local_158 [8];
  Pubkey expect_pubkey;
  Message local_138;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  Message local_f8 [2];
  Privkey local_e8;
  undefined1 local_c8 [8];
  Privkey priv_tweak_added;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 tweak;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey privkey;
  Privkey_TweakConversionTest_Test *this_local;
  
  privkey._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"036b13c5a0dd9935fe175b2b9ff86585c231e734b2148149d788a941f1f4f566",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e",
             (allocator *)((long)&priv_tweak_added.net_type_ + 3));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&priv_tweak_added.net_type_ + 3));
  cfd::core::Privkey::Privkey((Privkey *)local_c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Privkey::CreateTweakAdd(&local_e8,(Privkey *)local_30,(ByteData256 *)local_80);
      cfd::core::Privkey::operator=((Privkey *)local_c8,&local_e8);
      cfd::core::Privkey::~Privkey(&local_e8);
    }
  }
  else {
    testing::Message::Message(local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0xfc,
               "Expected: priv_tweak_added = privkey.CreateTweakAdd(tweak) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_f8);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_130,(Privkey *)local_c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_110,"priv_tweak_added.GetHex().c_str()",
             "\"9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4\"",pcVar2,
             "9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4");
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expect_pubkey.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expect_pubkey.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_138);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expect_pubkey.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)&gtest_ar_.message_,(Privkey *)local_30,true);
  cfd::core::Pubkey::CreateTweakAdd
            ((Pubkey *)local_158,(Pubkey *)&gtest_ar_.message_,(ByteData256 *)local_80);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_.message_);
  cfd::core::Privkey::GeneratePubkey(&local_1a0,(Privkey *)local_c8,true);
  local_181 = cfd::core::Pubkey::Equals((Pubkey *)local_158,&local_1a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  cfd::core::Pubkey::~Pubkey(&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&priv_tweak_mul.is_compressed_,(internal *)local_180,
               (AssertionResult *)"expect_pubkey.Equals(priv_tweak_added.GeneratePubkey())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&priv_tweak_mul.is_compressed_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_158);
  cfd::core::Privkey::~Privkey((Privkey *)local_c8);
  cfd::core::Privkey::Privkey((Privkey *)local_1f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Privkey::CreateTweakMul(&local_210,(Privkey *)local_30,(ByteData256 *)local_80);
      cfd::core::Privkey::operator=((Privkey *)local_1f0,&local_210);
      cfd::core::Privkey::~Privkey(&local_210);
    }
  }
  else {
    testing::Message::Message(&local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x106,
               "Expected: priv_tweak_mul = privkey.CreateTweakMul(tweak) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_218);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_250,(Privkey *)local_1f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"priv_tweak_mul.GetHex().c_str()",
             "\"aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957\"",pcVar2,
             "aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957");
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expect_pubkey_1.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expect_pubkey_1.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_258);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expect_pubkey_1.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)&gtest_ar__1.message_,(Privkey *)local_30,true);
  cfd::core::Pubkey::CreateTweakMul
            ((Pubkey *)local_278,(Pubkey *)&gtest_ar__1.message_,(ByteData256 *)local_80);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar__1.message_);
  cfd::core::Privkey::GeneratePubkey(&local_2c0,(Privkey *)local_1f0,true);
  local_2a1 = cfd::core::Pubkey::Equals((Pubkey *)local_278,&local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  cfd::core::Pubkey::~Pubkey(&local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_2a0,
               (AssertionResult *)"expect_pubkey.Equals(priv_tweak_mul.GeneratePubkey())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_278);
  cfd::core::Privkey::~Privkey((Privkey *)local_1f0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(Privkey, TweakConversionTest) {
  Privkey privkey("036b13c5a0dd9935fe175b2b9ff86585c231e734b2148149d788a941f1f4f566");
  ByteData256 tweak("98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e");

  // test for adding tweak
  {
    Privkey priv_tweak_added;
    EXPECT_NO_THROW(priv_tweak_added = privkey.CreateTweakAdd(tweak));
    EXPECT_STREQ(priv_tweak_added.GetHex().c_str(), "9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4");

    Pubkey expect_pubkey = privkey.GeneratePubkey().CreateTweakAdd(tweak);
    EXPECT_TRUE(expect_pubkey.Equals(priv_tweak_added.GeneratePubkey()));
  }

  // test for multiplying tweak
  {
    Privkey priv_tweak_mul;
    EXPECT_NO_THROW(priv_tweak_mul = privkey.CreateTweakMul(tweak));
    EXPECT_STREQ(priv_tweak_mul.GetHex().c_str(), "aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957");

    Pubkey expect_pubkey = privkey.GeneratePubkey().CreateTweakMul(tweak);
    EXPECT_TRUE(expect_pubkey.Equals(priv_tweak_mul.GeneratePubkey()));
  }
}